

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.c
# Opt level: O0

double eps(double x)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int t2;
  double epsv;
  double t;
  double y;
  double x_local;
  
  dVar1 = pow(2.0,-52.0);
  y = x;
  if (x < 0.0) {
    y = -x;
  }
  if ((0.0 < y) && (y < 1.0)) {
    y = y / 2.0;
  }
  dVar2 = log(y);
  dVar3 = log(2.0);
  dVar2 = pow(2.0,(double)(int)(dVar2 / dVar3));
  return dVar1 * dVar2;
}

Assistant:

double eps(double x) {
	double y,t,epsv;
	int t2;
	
	epsv = pow(2.0,-52.0);
	if (x < 0.) {
		x = - x;
	}
	
	if ( x > 0. && x < 1.0) {
		x /= 2.;
	}
	t2 = (int) ( log(x) / log ((double) 2.0));
	t = pow(2.0,(double) t2);
	
	y = epsv * t;
	return y;
}